

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t find_cab_magic(char *p)

{
  char cVar1;
  char *p_local;
  
  cVar1 = p[4];
  if (cVar1 == '\0') {
    if (*(long *)p == 0x4643534d) {
      p_local._4_4_ = L'\0';
    }
    else {
      p_local._4_4_ = L'\x05';
    }
  }
  else if (cVar1 == 'C') {
    p_local._4_4_ = L'\x02';
  }
  else if (cVar1 == 'F') {
    p_local._4_4_ = L'\x01';
  }
  else if (cVar1 == 'M') {
    p_local._4_4_ = L'\x04';
  }
  else if (cVar1 == 'S') {
    p_local._4_4_ = L'\x03';
  }
  else {
    p_local._4_4_ = L'\x05';
  }
  return p_local._4_4_;
}

Assistant:

static int
find_cab_magic(const char *p)
{
	switch (p[4]) {
	case 0:
		/*
		 * Note: Self-Extraction program has 'MSCF' string in their
		 * program. If we were finding 'MSCF' string only, we got
		 * wrong place for Cabinet header, thus, we have to check
		 * following four bytes which are reserved and must be set
		 * to zero.
		 */
		if (memcmp(p, "MSCF\0\0\0\0", 8) == 0)
			return 0;
		return 5;
	case 'F': return 1;
	case 'C': return 2;
	case 'S': return 3;
	case 'M': return 4;
	default:  return 5;
	}
}